

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

size_t __thiscall
absl::lts_20250127::Cord::EstimatedMemoryUsage(Cord *this,CordMemoryAccounting accounting_method)

{
  Nullable<absl::cord_internal::CordRep_*> rep_00;
  size_t sVar1;
  CordRep *rep;
  size_t result;
  CordMemoryAccounting accounting_method_local;
  Cord *this_local;
  
  rep = (CordRep *)0x10;
  rep_00 = InlineRep::tree(&this->contents_);
  if (rep_00 != (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    if (accounting_method == kTotal) {
      sVar1 = cord_internal::GetEstimatedMemoryUsage(rep_00);
      rep = (CordRep *)(sVar1 + 0x10);
    }
    else if (accounting_method == kTotalMorePrecise) {
      sVar1 = cord_internal::GetMorePreciseMemoryUsage(rep_00);
      rep = (CordRep *)(sVar1 + 0x10);
    }
    else if (accounting_method == kFairShare) {
      sVar1 = cord_internal::GetEstimatedFairShareMemoryUsage(rep_00);
      rep = (CordRep *)(sVar1 + 0x10);
    }
  }
  return (size_t)rep;
}

Assistant:

inline size_t Cord::EstimatedMemoryUsage(
    CordMemoryAccounting accounting_method) const {
  size_t result = sizeof(Cord);
  if (const absl::cord_internal::CordRep* rep = contents_.tree()) {
    switch (accounting_method) {
      case CordMemoryAccounting::kFairShare:
        result += cord_internal::GetEstimatedFairShareMemoryUsage(rep);
        break;
      case CordMemoryAccounting::kTotalMorePrecise:
        result += cord_internal::GetMorePreciseMemoryUsage(rep);
        break;
      case CordMemoryAccounting::kTotal:
        result += cord_internal::GetEstimatedMemoryUsage(rep);
        break;
    }
  }
  return result;
}